

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkCopyAccelerationStructureModeKHR
Diligent::CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)

{
  VkCopyAccelerationStructureModeKHR VVar1;
  undefined7 in_register_00000039;
  string msg;
  string local_28;
  
  VVar1 = (VkCopyAccelerationStructureModeKHR)CONCAT71(in_register_00000039,Mode);
  if (VVar1 != VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR) {
    if (VVar1 == VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR) {
      VVar1 = VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR;
    }
    else {
      FormatString<char[21]>(&local_28,(char (*) [21])"unknown AS copy mode");
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"CopyASModeToVkCopyAccelerationStructureMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x719);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      VVar1 = VK_COPY_ACCELERATION_STRUCTURE_MODE_MAX_ENUM_KHR;
    }
  }
  return VVar1;
}

Assistant:

VkCopyAccelerationStructureModeKHR CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)
{
    static_assert(COPY_AS_MODE_LAST == COPY_AS_MODE_COMPACT,
                  "Please update the switch below to handle the new copy AS mode");

    switch (Mode)
    {
        // clang-format off
        case COPY_AS_MODE_CLONE:   return VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR;
        case COPY_AS_MODE_COMPACT: return VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR;
        // clang-format on
        default:
            UNEXPECTED("unknown AS copy mode");
            return VK_COPY_ACCELERATION_STRUCTURE_MODE_MAX_ENUM_KHR;
    }
}